

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void and_ALIb(PDISASM pMyDisasm)

{
  REGISTERTYPE *pRVar1;
  Int64 *pIVar2;
  UInt8 UVar3;
  UInt8 UVar4;
  UInt8 UVar5;
  UInt8 UVar6;
  UInt8 UVar7;
  UInt8 UVar8;
  UInt8 UVar9;
  
  if ((pMyDisasm->Prefix).LockPrefix == '\x04') {
    (pMyDisasm->Prefix).LockPrefix = '\x01';
  }
  (pMyDisasm->Instruction).Category = 0x10003;
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"and",4);
  ALIb(pMyDisasm);
  pRVar1 = &(pMyDisasm->Instruction).ImplicitModifiedRegs;
  *(byte *)&pRVar1->type = (byte)pRVar1->type | 0x20;
  pIVar2 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
  *(byte *)pIVar2 = (byte)*pIVar2 | 1;
  UVar3 = EFLAGS_TABLE[6].SF_;
  UVar4 = EFLAGS_TABLE[6].ZF_;
  UVar5 = EFLAGS_TABLE[6].AF_;
  UVar6 = EFLAGS_TABLE[6].PF_;
  UVar7 = EFLAGS_TABLE[6].CF_;
  UVar8 = EFLAGS_TABLE[6].TF_;
  UVar9 = EFLAGS_TABLE[6].IF_;
  (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[6].OF_;
  (pMyDisasm->Instruction).Flags.SF_ = UVar3;
  (pMyDisasm->Instruction).Flags.ZF_ = UVar4;
  (pMyDisasm->Instruction).Flags.AF_ = UVar5;
  (pMyDisasm->Instruction).Flags.PF_ = UVar6;
  (pMyDisasm->Instruction).Flags.CF_ = UVar7;
  (pMyDisasm->Instruction).Flags.TF_ = UVar8;
  (pMyDisasm->Instruction).Flags.IF_ = UVar9;
  UVar3 = EFLAGS_TABLE[6].NT_;
  UVar4 = EFLAGS_TABLE[6].RF_;
  UVar5 = EFLAGS_TABLE[6].alignment;
  (pMyDisasm->Instruction).Flags.DF_ = EFLAGS_TABLE[6].DF_;
  (pMyDisasm->Instruction).Flags.NT_ = UVar3;
  (pMyDisasm->Instruction).Flags.RF_ = UVar4;
  (pMyDisasm->Instruction).Flags.alignment = UVar5;
  return;
}

Assistant:

void __bea_callspec__ and_ALIb(PDISASM pMyDisasm)
{
  if (pMyDisasm->Prefix.LockPrefix == InvalidPrefix) {
    pMyDisasm->Prefix.LockPrefix = InUsePrefix;
  }
  pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+LOGICAL_INSTRUCTION;
  #ifndef BEA_LIGHT_DISASSEMBLY
     (void) strcpy (pMyDisasm->Instruction.Mnemonic, "and");
  #endif
  ALIb(pMyDisasm);
  FillFlags(pMyDisasm,6);
}